

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkMissedBreak(CheckerVisitor *this,SwitchStatement *swtch)

{
  Node *n;
  Node *pNVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Node *pNVar5;
  ulong uVar6;
  SwitchCase *pSVar7;
  long lVar8;
  Node *pNVar9;
  int iVar10;
  int iVar11;
  SwitchCase *pSVar12;
  FunctionReturnTypeEvaluator rtEvaluator;
  FunctionReturnTypeEvaluator local_40;
  
  if ((this->effectsOnly != false) || (uVar6 = (ulong)(swtch->_cases)._size, uVar6 == 0)) {
    return;
  }
  pSVar7 = (swtch->_cases)._vals;
  pSVar12 = pSVar7 + uVar6;
  pNVar9 = (Node *)0x0;
  local_40.checker = this;
LAB_00153649:
  if (pNVar9 != (Node *)0x0) {
    report(this,pNVar9,0x72);
  }
  n = &pSVar7->stmt->super_Node;
  local_40.flags = 0;
  bVar4 = FunctionReturnTypeEvaluator::checkNode(&local_40,(Statement *)n);
  if (!bVar4) {
    local_40.flags = local_40.flags | 1;
    pNVar9 = n;
    do {
      if (pNVar9 == (Node *)0x0) break;
      if (pNVar9->_op != TO_BLOCK) {
        if (n != (Node *)0x0 && pNVar9->_op != TO_BREAK) goto LAB_001536f0;
        break;
      }
      uVar6 = (ulong)(uint)pNVar9[1]._coordinates.lineEnd;
      if (uVar6 == 0) break;
      pNVar1 = pNVar9 + 1;
      lVar8 = 0;
      iVar10 = 0;
      iVar11 = 0;
      pNVar5 = (Node *)0x0;
      do {
        pNVar9 = *(Node **)(*(long *)&pNVar1->_coordinates + lVar8);
        iVar2 = iVar11 + 1;
        iVar3 = iVar11 + 1;
        if (pNVar9->_op == TO_EMPTY) {
          pNVar9 = pNVar5;
          iVar2 = iVar11;
          iVar3 = iVar10;
        }
        iVar10 = iVar3;
        iVar11 = iVar2;
        lVar8 = lVar8 + 8;
        pNVar5 = pNVar9;
      } while (uVar6 << 3 != lVar8);
    } while (iVar10 != 0);
  }
LAB_00153678:
  pNVar9 = (Node *)0x0;
  goto LAB_0015367a;
  while( true ) {
    iVar11 = pNVar9[1]._coordinates.lineEnd;
    if (iVar11 == 0) goto LAB_00153678;
    n = *(Node **)(*(long *)&pNVar9[1]._coordinates + (ulong)(iVar11 - 1) * 8);
    pNVar9 = (Node *)0x0;
    if (n == (Node *)0x0) break;
LAB_001536f0:
    pNVar9 = n;
    if (pNVar9->_op != TO_BLOCK) break;
  }
LAB_0015367a:
  pSVar7 = pSVar7 + 1;
  if (pSVar7 == pSVar12) {
    if (pNVar9 == (Node *)0x0) {
      return;
    }
    if ((swtch->_defaultCase).stmt == (Statement *)0x0) {
      return;
    }
    report(this,pNVar9,0x72);
    return;
  }
  goto LAB_00153649;
}

Assistant:

void CheckerVisitor::checkMissedBreak(const SwitchStatement *swtch) {
  if (effectsOnly)
    return;

  auto &cases = swtch->cases();

  FunctionReturnTypeEvaluator rtEvaluator(this);

  const Statement *last = nullptr;
  for (auto &c : cases) {

    if (last) {
      report(last, DiagnosticsId::DI_MISSED_BREAK);
    }
    last = nullptr;

    const Statement *stmt = c.stmt;
    bool r = false;
    rtEvaluator.compute(stmt, r);
    if (!r) {
      const Statement *uw = unwrapBodyNonEmpty(stmt);

      if (!uw)
        continue; // empty case statement -> FT

      const enum TreeOp op = uw->op();
      if (op != TO_BLOCK) {
        if (op != TO_BREAK)
          last = unwrapBody(stmt);
      }
      else {
        const Block *b = uw->asBlock();
        int32_t dummy;
        const Statement *tmp = lastNonEmpty(b, dummy);
        if (tmp && tmp->op() != TO_BREAK) {
          last = unwrapBody(b);
        }
      }
    }
  }

  if (last && swtch->defaultCase().stmt) {
    /*
      switch (x) {
        case A:
          ...
          break;

        case B:
          ...   <-- missed break
        default:
          ...
      }
    */
    report(last, DiagnosticsId::DI_MISSED_BREAK);
  }
}